

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeImportTableSet(TranslateToFuzzReader *this,Type type)

{
  char *pcVar1;
  size_t sVar2;
  Call *pCVar3;
  initializer_list<wasm::Expression_*> __l;
  Name target;
  Expression *local_60;
  Expression *local_58;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_50;
  allocator_type local_31;
  
  if (type.id != 0) {
    __assert_fail("type == Type::none",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x4e8,"Expression *wasm::TranslateToFuzzReader::makeImportTableSet(Type)");
  }
  pcVar1 = (this->tableSetImportName).super_IString.str._M_str;
  if (pcVar1 != (char *)0x0) {
    sVar2 = (this->tableSetImportName).super_IString.str._M_len;
    local_60 = make(this,(Type)0x2);
    local_58 = makeBasicRef(this,(Type)0x12);
    __l._M_len = 2;
    __l._M_array = &local_60;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              (&local_50,__l,&local_31);
    target.super_IString.str._M_str = pcVar1;
    target.super_IString.str._M_len = sVar2;
    pCVar3 = Builder::makeCall(&this->builder,target,&local_50,(Type)0x0,false);
    if (local_50.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_50.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return (Expression *)pCVar3;
  }
  __assert_fail("tableSetImportName",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x4e9,"Expression *wasm::TranslateToFuzzReader::makeImportTableSet(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeImportTableSet(Type type) {
  assert(type == Type::none);
  assert(tableSetImportName);
  return builder.makeCall(
    tableSetImportName,
    {make(Type::i32), makeBasicRef(Type(HeapType::func, Nullable))},
    Type::none);
}